

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

Image * __thiscall
deqp::gls::FboUtil::config::Framebuffer::getImage(Framebuffer *this,GLenum type,GLuint imgName)

{
  mapped_type *ppTVar1;
  mapped_type *ppRVar2;
  mapped_type local_30;
  mapped_type local_28;
  GLuint local_20;
  GLenum local_1c;
  GLuint imgName_local;
  GLenum type_local;
  Framebuffer *this_local;
  
  local_20 = imgName;
  local_1c = type;
  _imgName_local = this;
  if (type == 0x1702) {
    local_28 = (mapped_type)0x0;
    ppTVar1 = de::
              lookupDefault<std::map<unsigned_int,deqp::gls::FboUtil::config::Texture_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,deqp::gls::FboUtil::config::Texture_const*>>>>
                        (&this->textures,&local_20,&local_28);
    this_local = (Framebuffer *)*ppTVar1;
  }
  else if (type == 0x8d41) {
    local_30 = (mapped_type)0x0;
    ppRVar2 = de::
              lookupDefault<std::map<unsigned_int,deqp::gls::FboUtil::config::Renderbuffer_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,deqp::gls::FboUtil::config::Renderbuffer_const*>>>>
                        (&this->rbos,&local_20,&local_30);
    this_local = (Framebuffer *)*ppRVar2;
  }
  else {
    this_local = (Framebuffer *)0x0;
  }
  return (Image *)this_local;
}

Assistant:

const Image* Framebuffer::getImage (GLenum type, glw::GLuint imgName) const
{
	switch (type)
	{
		case GL_TEXTURE:
			return de::lookupDefault(textures, imgName, DE_NULL);
		case GL_RENDERBUFFER:
			return de::lookupDefault(rbos, imgName, DE_NULL);
		default:
			DE_FATAL("Bad image type");
	}
	return DE_NULL; // shut up compiler warning
}